

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O3

SstStream CP_newStream(void)

{
  SstStream p_Var1;
  char *pcVar2;
  int *piVar3;
  
  p_Var1 = (SstStream)calloc(1,0x310);
  pthread_mutex_init((pthread_mutex_t *)&p_Var1->DataLock,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&p_Var1->DataCondition,(pthread_condattr_t *)0x0);
  p_Var1->ReaderTimestep = -1;
  p_Var1->DiscardPriorTimestep = -1;
  piVar3 = &p_Var1->CPVerbosityLevel;
  *(undefined4 *)&p_Var1->WriterTimestep = 0xffffffff;
  *(undefined4 *)((long)&p_Var1->WriterTimestep + 4) = 0xffffffff;
  *(undefined4 *)&p_Var1->LastReleasedTimestep = 0xffffffff;
  *(undefined4 *)((long)&p_Var1->LastReleasedTimestep + 4) = 0xffffffff;
  *(undefined4 *)&p_Var1->LastDemandTimestep = 0xffffffff;
  *(undefined4 *)((long)&p_Var1->LastDemandTimestep + 4) = 0xffffffff;
  *(undefined4 *)&p_Var1->CloseTimestepCount = 0xffffffff;
  *(undefined4 *)((long)&p_Var1->CloseTimestepCount + 4) = 0xffffffff;
  p_Var1->CPVerbosityLevel = 1;
  p_Var1->DPVerbosityLevel = 1;
  pcVar2 = getenv("SstVerbose");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = getenv("SstCPVerbose");
    if (pcVar2 == (char *)0x0) {
      return p_Var1;
    }
  }
  else {
    __isoc99_sscanf(pcVar2,"%d",piVar3);
    piVar3 = &p_Var1->DPVerbosityLevel;
  }
  __isoc99_sscanf(pcVar2,"%d",piVar3);
  return p_Var1;
}

Assistant:

SstStream CP_newStream()
{
    SstStream Stream = malloc(sizeof(*Stream));
    char *CPEnvValue = NULL;
    char *DPEnvValue = NULL;
    memset(Stream, 0, sizeof(*Stream));
    pthread_mutex_init(&Stream->DataLock, NULL);
    pthread_cond_init(&Stream->DataCondition, NULL);
    Stream->WriterTimestep = -1; // Filled in by ProvideTimestep
    Stream->ReaderTimestep = -1; // first beginstep will get us timestep 0
    Stream->CloseTimestepCount = (size_t)-1;
    Stream->LastDemandTimestep = (size_t)-1;
    Stream->LastReleasedTimestep = -1;
    Stream->DiscardPriorTimestep = -1; // Timesteps prior to this discarded/released upon arrival
    Stream->CPVerbosityLevel = CriticalVerbose;
    Stream->DPVerbosityLevel = CriticalVerbose;
    if ((CPEnvValue = getenv("SstVerbose")))
    {
        DPEnvValue = CPEnvValue;
    }
    else
    {
        CPEnvValue = getenv("SstCPVerbose");
    }
    if (CPEnvValue)
    {
        sscanf(CPEnvValue, "%d", &Stream->CPVerbosityLevel);
    }
    if (DPEnvValue)
    {
        sscanf(DPEnvValue, "%d", &Stream->DPVerbosityLevel);
    }
    return Stream;
}